

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::NeedBailOnImplicitCallForLiveValues(GlobOpt *this,BasicBlock *block,bool isForwardPass)

{
  ValueSet *pVVar1;
  code *pcVar2;
  undefined4 *puVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  undefined7 in_register_00000011;
  bool bVar5;
  
  if ((int)CONCAT71(in_register_00000011,isForwardPass) == 0) {
    pBVar4 = block->noImplicitCallUses;
    do {
      pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        pBVar4 = block->noImplicitCallNoMissingValuesUses;
        goto LAB_00467785;
      }
    } while (((Type *)&pBVar4->alloc)->word == 0);
    bVar5 = true;
  }
  else {
    pVVar1 = (block->globOptData).valuesToKillOnCalls;
    bVar5 = (pVVar1->
            super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ).count !=
            (pVVar1->
            super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ).freeCount;
  }
  return bVar5;
  while (((Type *)&pBVar4->alloc)->word == 0) {
LAB_00467785:
    pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
    if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004677e9;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x3463,"(block->noImplicitCallNoMissingValuesUses->IsEmpty())",
                     "block->noImplicitCallNoMissingValuesUses->IsEmpty()");
  if (bVar5) {
    *puVar3 = 0;
LAB_004677e9:
    pBVar4 = block->noImplicitCallNativeArrayUses;
    do {
      pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00467854;
    } while (((Type *)&pBVar4->alloc)->word == 0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3464,"(block->noImplicitCallNativeArrayUses->IsEmpty())",
                       "block->noImplicitCallNativeArrayUses->IsEmpty()");
    if (bVar5) {
      *puVar3 = 0;
LAB_00467854:
      pBVar4 = block->noImplicitCallJsArrayHeadSegmentSymUses;
      do {
        pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
        if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004678bb;
      } while (((Type *)&pBVar4->alloc)->word == 0);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3465,"(block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())",
                         "block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty()");
      if (bVar5) {
        *puVar3 = 0;
LAB_004678bb:
        pBVar4 = block->noImplicitCallArrayLengthSymUses;
        do {
          pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
          if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            return false;
          }
        } while (((Type *)&pBVar4->alloc)->word == 0);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3466,"(block->noImplicitCallArrayLengthSymUses->IsEmpty())",
                           "block->noImplicitCallArrayLengthSymUses->IsEmpty()");
        if (bVar5) {
          *puVar3 = 0;
          return false;
        }
      }
    }
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

bool
GlobOpt::NeedBailOnImplicitCallForLiveValues(BasicBlock const * const block, const bool isForwardPass) const
{
    if(isForwardPass)
    {
        return block->globOptData.valuesToKillOnCalls->Count() != 0;
    }

    if(block->noImplicitCallUses->IsEmpty())
    {
        Assert(block->noImplicitCallNoMissingValuesUses->IsEmpty());
        Assert(block->noImplicitCallNativeArrayUses->IsEmpty());
        Assert(block->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty());
        Assert(block->noImplicitCallArrayLengthSymUses->IsEmpty());
        return false;
    }

    return true;
}